

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall amrex::StateData::copyNew(StateData *this,StateData *state)

{
  FabArrayBase *this_00;
  StateData *this_01;
  long in_RSI;
  MultiFab *in_RDI;
  MultiFab *unaff_retaddr;
  int ng;
  int nc;
  MultiFab *MF;
  StateData *in_stack_ffffffffffffffd0;
  MultiFab *src;
  
  src = in_RDI;
  this_00 = (FabArrayBase *)newData(in_stack_ffffffffffffffd0);
  FabArrayBase::nComp(this_00);
  FabArrayBase::nGrow(this_00,0);
  this_01 = (StateData *)
            std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                      ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                       in_stack_ffffffffffffffd0);
  newData(this_01);
  MultiFab::Copy(unaff_retaddr,src,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                 (int)((ulong)this_00 >> 0x20),(int)this_00);
  (in_RDI->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.ownership.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = *(_Bit_type **)(in_RSI + 0xa8);
  *(undefined8 *)
   ((long)&(in_RDI->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.ownership.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish + 8
   ) = *(undefined8 *)(in_RSI + 0xb0);
  return;
}

Assistant:

void
StateData::copyNew (const StateData& state)
{
    const MultiFab& MF = state.newData();

    int nc = MF.nComp();
    int ng = MF.nGrow();

    BL_ASSERT(nc == (*new_data).nComp());
    BL_ASSERT(ng == (*new_data).nGrow());

    MultiFab::Copy(*new_data, state.newData(), 0, 0, nc, ng);

    new_time = state.new_time;
}